

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.cpp
# Opt level: O1

void __thiscall CControls::OnConsoleInit(CControls *this)

{
  IConsole *pIVar1;
  
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+left","",2,ConKeyInputState,&this->m_InputDirectionLeft,"Move left");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+right","",2,ConKeyInputState,&this->m_InputDirectionRight,"Move right");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+jump","",2,ConKeyInputState,&(this->m_InputData).m_Jump,"Jump");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+hook","",2,ConKeyInputState,&(this->m_InputData).m_Hook,"Hook");
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+fire","",2,ConKeyInputCounter,&(this->m_InputData).m_Fire,"Fire");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+weapon1","",2,ConKeyInputSet,&OnConsoleInit::s_Set,"Switch to hammer");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+weapon2","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to gun");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+weapon3","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to shotgun");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+weapon4","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to grenade");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+weapon5","",2,ConKeyInputSet,&OnConsoleInit()::s_Set,"Switch to laser");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+nextweapon","",2,ConKeyInputNextPrevWeapon,&OnConsoleInit()::s_Set,
             "Switch to next weapon");
  if (OnConsoleInit()::s_Set == '\0') {
    OnConsoleInit(this);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pConsole;
  (*(pIVar1->super_IInterface)._vptr_IInterface[8])
            (pIVar1,"+prevweapon","",2,ConKeyInputNextPrevWeapon,&OnConsoleInit()::s_Set,
             "Switch to previous weapon");
  return;
}

Assistant:

void CControls::OnConsoleInit()
{
	// game commands
	Console()->Register("+left", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputDirectionLeft, "Move left");
	Console()->Register("+right", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputDirectionRight, "Move right");
	Console()->Register("+jump", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputData.m_Jump, "Jump");
	Console()->Register("+hook", "", CFGFLAG_CLIENT, ConKeyInputState, &m_InputData.m_Hook, "Hook");
	Console()->Register("+fire", "", CFGFLAG_CLIENT, ConKeyInputCounter, &m_InputData.m_Fire, "Fire");

	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 1}; Console()->Register("+weapon1", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to hammer"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 2}; Console()->Register("+weapon2", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to gun"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 3}; Console()->Register("+weapon3", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to shotgun"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 4}; Console()->Register("+weapon4", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to grenade"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_WantedWeapon, 5}; Console()->Register("+weapon5", "", CFGFLAG_CLIENT, ConKeyInputSet, (void *)&s_Set, "Switch to laser"); }

	{ static CInputSet s_Set = {this, &m_InputData.m_NextWeapon, 0}; Console()->Register("+nextweapon", "", CFGFLAG_CLIENT, ConKeyInputNextPrevWeapon, (void *)&s_Set, "Switch to next weapon"); }
	{ static CInputSet s_Set = {this, &m_InputData.m_PrevWeapon, 0}; Console()->Register("+prevweapon", "", CFGFLAG_CLIENT, ConKeyInputNextPrevWeapon, (void *)&s_Set, "Switch to previous weapon"); }
}